

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

void __thiscall caldate_t::set_dayno(caldate_t *this,int32_t dayno)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int a;
  int iVar6;
  double dVar7;
  
  dVar7 = floor(((double)dayno * 10000.0 + 14780.0) / 3652425.0);
  a = (int)dVar7;
  iVar2 = divfl(a,4);
  iVar3 = divfl(a,100);
  iVar4 = divfl(a,400);
  iVar6 = (iVar3 + dayno + a * -0x16d) - (iVar4 + iVar2);
  if (iVar6 < 0) {
    a = a + -1;
    iVar2 = divfl(a,4);
    iVar3 = divfl(a,100);
    iVar4 = divfl(a,400);
    iVar6 = (dayno + iVar3 + a * -0x16d) - (iVar4 + iVar2);
  }
  iVar1 = (iVar6 * 100 + 0x34) / 0xbf4;
  iVar5 = iVar1 + 2;
  this->y = iVar5 / 0xc + a;
  this->m = iVar5 % 0xc + 1;
  this->d = (iVar1 * 0x132 + 5) / -10 + iVar6 + 1;
  return;
}

Assistant:

void set_dayno(int32_t dayno)
    {
        int32_t y = (int32_t)floor((10000*(double)dayno + 14780)/3652425.0);
        int32_t d = dayno - (365*y + divfl(y, 4) - divfl(y, 100)
                             + divfl(y, 400));
        if (d < 0)
        {
            y -= 1;
            d = dayno - (365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400));
        }
        int32_t m = (100*d + 52)/3060;

        this->y = y + (m+2)/12;
        this->m = (m + 2)%12 + 1;
        this->d = d - (m*306 + 5)/10 + 1;
    }